

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::~ExtensionRangeOptions_Declaration
          (ExtensionRangeOptions_Declaration *this)

{
  ~ExtensionRangeOptions_Declaration(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ExtensionRangeOptions_Declaration::~ExtensionRangeOptions_Declaration() {
  // @@protoc_insertion_point(destructor:google.protobuf.ExtensionRangeOptions.Declaration)
  SharedDtor(*this);
}